

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O2

Lf_Man_t * Lf_ManAlloc(Gia_Man_t *pGia,Jf_Par_t *pPars)

{
  Vec_Ptr_t *p;
  int iVar1;
  int iVar2;
  Lf_Man_t *pLVar3;
  abctime aVar4;
  word *pwVar5;
  Vec_Mem_t *p_00;
  Vec_Int_t *pVVar6;
  Lf_Bst_t *pLVar7;
  Gia_Obj_t *pGVar8;
  int iVar9;
  long lVar10;
  float Entry;
  
  if (0x1e < pPars->nCutNum - 2U) {
    __assert_fail("pPars->nCutNum > 1 && pPars->nCutNum <= LF_CUT_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaLf.c"
                  ,0x76d,"Lf_Man_t *Lf_ManAlloc(Gia_Man_t *, Jf_Par_t *)");
  }
  if (10 < pPars->nLutSize - 2U) {
    __assert_fail("pPars->nLutSize > 1 && pPars->nLutSize <= LF_LEAF_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaLf.c"
                  ,0x76e,"Lf_Man_t *Lf_ManAlloc(Gia_Man_t *, Jf_Par_t *)");
  }
  if (pGia->pRefs != (int *)0x0) {
    free(pGia->pRefs);
    pGia->pRefs = (int *)0x0;
  }
  Vec_IntFreeP(&pGia->vMapping);
  Gia_ManCleanValue(pGia);
  if (pGia->pSibls != (int *)0x0) {
    Gia_ManSetPhase(pGia);
  }
  pLVar3 = (Lf_Man_t *)calloc(1,0x1a0);
  Lf_ManAnalyzeCoDrivers(pGia,&pLVar3->nCoDrivers,&pLVar3->nInverters);
  if (pPars->fPower != 0) {
    Lf_ManComputeSwitching(pGia,&pLVar3->vSwitches);
  }
  aVar4 = Abc_Clock();
  pLVar3->clkStart = aVar4;
  pLVar3->pGia = pGia;
  pLVar3->pPars = pPars;
  iVar1 = pPars->nLutSize;
  iVar9 = (int)((long)iVar1 + 7U >> 1);
  pLVar3->nCutWords = iVar9;
  pLVar3->nSetWords = iVar9 * pPars->nCutNum;
  if (pPars->fCutMin == 0) {
    pLVar3->vTtMem = (Vec_Mem_t *)0x0;
  }
  else {
    iVar9 = 1 << ((char)iVar1 - 6U & 0x1f);
    if (iVar1 < 7) {
      iVar9 = 1;
    }
    pwVar5 = (word *)calloc(1,(long)iVar9 * 8);
    p_00 = (Vec_Mem_t *)calloc(1,0x30);
    p_00->nEntrySize = iVar9;
    p_00->LogPageSze = 0xc;
    p_00->PageMask = 0xfff;
    p_00->iPage = -1;
    iVar1 = Abc_PrimeCudd(10000);
    pVVar6 = Vec_IntStartFull(iVar1);
    p_00->vTable = pVVar6;
    pVVar6 = Vec_IntAlloc(10000);
    p_00->vNexts = pVVar6;
    iVar1 = Vec_MemHashInsert(p_00,pwVar5);
    if (iVar1 != 0) {
      __assert_fail("Value == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecMem.h"
                    ,0x189,"Vec_Mem_t *Vec_MemAllocForTT(int, int)");
    }
    memset(pwVar5,0xaa,(long)iVar9 * 8);
    iVar1 = Vec_MemHashInsert(p_00,pwVar5);
    if (iVar1 != 1) {
      __assert_fail("Value == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecMem.h"
                    ,0x18e,"Vec_Mem_t *Vec_MemAllocForTT(int, int)");
    }
    free(pwVar5);
    iVar1 = pPars->fCutMin;
    pLVar3->vTtMem = p_00;
    if ((iVar1 != 0) && (pPars->fUseMux7 != 0)) {
      iVar1 = 1 << ((char)pPars->nLutSize - 6U & 0x1f);
      if (pPars->nLutSize < 7) {
        iVar1 = 1;
      }
      pwVar5 = (word *)malloc((long)iVar1 << 3);
      memset(pwVar5,0xca,(long)iVar1 << 3);
      iVar1 = Vec_MemHashInsert(p_00,pwVar5);
      if (iVar1 != 2) {
        __assert_fail("Value == 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecMem.h"
                      ,0x197,"void Vec_MemAddMuxTT(Vec_Mem_t *, int)");
      }
      free(pwVar5);
    }
  }
  iVar1 = Gia_ManAndNotBufNum(pGia);
  pLVar7 = (Lf_Bst_t *)calloc((long)iVar1,0x20);
  pLVar3->pObjBests = pLVar7;
  Vec_IntGrow(&pLVar3->vFreeSets,0x4000);
  p = &pLVar3->vFreePages;
  Vec_PtrGrow(p,0x100);
  iVar1 = pLVar3->nCutWords;
  (pLVar3->vStoreOld).nCutWords = 0;
  (pLVar3->vStoreOld).iCur = 0;
  (pLVar3->vStoreOld).vPages.nCap = 0;
  (pLVar3->vStoreOld).vPages.nSize = 0;
  (pLVar3->vStoreOld).vPages.pArray = (void **)0x0;
  (pLVar3->vStoreOld).LogPage = 0x10;
  (pLVar3->vStoreOld).MaskPage = 0xffff;
  (pLVar3->vStoreOld).nCutWords = iVar1;
  (pLVar3->vStoreOld).vFree = p;
  (pLVar3->vStoreNew).nCutWords = 0;
  (pLVar3->vStoreNew).iCur = 0;
  (pLVar3->vStoreNew).vPages.nCap = 0;
  (pLVar3->vStoreNew).vPages.nSize = 0;
  (pLVar3->vStoreNew).vPages.pArray = (void **)0x0;
  (pLVar3->vStoreNew).LogPage = 0x10;
  (pLVar3->vStoreNew).MaskPage = 0xffff;
  (pLVar3->vStoreNew).nCutWords = iVar1;
  (pLVar3->vStoreNew).vFree = p;
  pVVar6 = &pLVar3->vOffsets;
  Vec_IntFill(pVVar6,pGia->nObjs,-1);
  Vec_IntFill(&pLVar3->vRequired,pGia->nObjs,1000000000);
  iVar1 = Gia_ManAndNotBufNum(pGia);
  Vec_IntFill(&pLVar3->vCutSets,iVar1,-1);
  iVar1 = Gia_ManAndNotBufNum(pGia);
  Vec_FltFill(&pLVar3->vFlowRefs,iVar1,Entry);
  iVar1 = Gia_ManAndNotBufNum(pGia);
  Vec_IntFill(&pLVar3->vMapRefs,iVar1,0);
  Vec_IntFill(&pLVar3->vCiArrivals,pGia->vCis->nSize,0);
  iVar1 = 0;
  for (iVar9 = 0; iVar9 < pGia->nObjs; iVar9 = iVar9 + 1) {
    pGVar8 = Gia_ManObj(pGia,iVar9);
    if ((~*(uint *)pGVar8 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar8) {
      pGVar8 = Gia_ManObj(pGia,iVar9);
      iVar2 = Gia_ObjIsBuf(pGVar8);
      if (iVar2 == 0) {
        Vec_IntWriteEntry(pVVar6,iVar9,iVar1);
        iVar1 = iVar1 + 1;
      }
    }
  }
  iVar9 = Gia_ManAndNotBufNum(pGia);
  if (iVar1 == iVar9) {
    Lf_ManSetFlowRefs(pGia,&pLVar3->vFlowRefs,pVVar6);
    if (pPars->pTimesArr != (float *)0x0) {
      for (lVar10 = 0; lVar10 < (long)pGia->vCis->nSize - (long)pGia->nRegs; lVar10 = lVar10 + 1) {
        Vec_IntWriteEntry(&pLVar3->vCiArrivals,(int)lVar10,(int)pPars->pTimesArr[lVar10]);
      }
    }
    return pLVar3;
  }
  __assert_fail("k == Gia_ManAndNotBufNum(pGia)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaLf.c"
                ,0x78e,"Lf_Man_t *Lf_ManAlloc(Gia_Man_t *, Jf_Par_t *)");
}

Assistant:

Lf_Man_t * Lf_ManAlloc( Gia_Man_t * pGia, Jf_Par_t * pPars )
{
    Lf_Man_t * p; int i, k = 0;
    assert( pPars->nCutNum > 1  && pPars->nCutNum <= LF_CUT_MAX );
    assert( pPars->nLutSize > 1 && pPars->nLutSize <= LF_LEAF_MAX );
    ABC_FREE( pGia->pRefs );
    Vec_IntFreeP( &pGia->vMapping );
    Gia_ManCleanValue( pGia );
    if ( Gia_ManHasChoices(pGia) )
        Gia_ManSetPhase(pGia);
    p = ABC_CALLOC( Lf_Man_t, 1 );
    Lf_ManAnalyzeCoDrivers( pGia, &p->nCoDrivers, &p->nInverters );
    if ( pPars->fPower )
        Lf_ManComputeSwitching( pGia, &p->vSwitches );
    p->clkStart  = Abc_Clock();
    p->pGia      = pGia;
    p->pPars     = pPars;
    p->nCutWords = (sizeof(Lf_Cut_t)/sizeof(int) + pPars->nLutSize + 1) >> 1;
    p->nSetWords = p->nCutWords * pPars->nCutNum;
    p->vTtMem    = pPars->fCutMin ? Vec_MemAllocForTT( pPars->nLutSize, 0 ) : NULL;
    if ( pPars->fCutMin && pPars->fUseMux7 )
        Vec_MemAddMuxTT( p->vTtMem, pPars->nLutSize );
    p->pObjBests = ABC_CALLOC( Lf_Bst_t, Gia_ManAndNotBufNum(pGia) );
    Vec_IntGrow( &p->vFreeSets, (1<<14) );
    Vec_PtrGrow( &p->vFreePages, 256 );
    Lf_MemAlloc( &p->vStoreOld, 16, &p->vFreePages, p->nCutWords );
    Lf_MemAlloc( &p->vStoreNew, 16, &p->vFreePages, p->nCutWords );
    Vec_IntFill( &p->vOffsets,  Gia_ManObjNum(pGia), -1 );
    Vec_IntFill( &p->vRequired, Gia_ManObjNum(pGia), ABC_INFINITY );
    Vec_IntFill( &p->vCutSets,  Gia_ManAndNotBufNum(pGia), -1 );
    Vec_FltFill( &p->vFlowRefs, Gia_ManAndNotBufNum(pGia), 0 );
    Vec_IntFill( &p->vMapRefs,  Gia_ManAndNotBufNum(pGia), 0 );
    Vec_IntFill( &p->vCiArrivals, Gia_ManCiNum(pGia), 0 );
    Gia_ManForEachAndId( pGia, i )
        if ( !Gia_ObjIsBuf(Gia_ManObj(pGia, i)) )
            Vec_IntWriteEntry( &p->vOffsets, i, k++ );
    assert( k == Gia_ManAndNotBufNum(pGia) );
    Lf_ManSetFlowRefs( pGia, &p->vFlowRefs, &p->vOffsets );
    if ( pPars->pTimesArr )
        for ( i = 0; i < Gia_ManPiNum(pGia); i++ )
            Vec_IntWriteEntry( &p->vCiArrivals, i, pPars->pTimesArr[i] );
    return p;
}